

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_validate.cpp
# Opt level: O1

void __thiscall
ktx::CommandValidate::OptionsValidate::process
          (OptionsValidate *this,Options *param_1,ParseResult *args,Reporter *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OptionValue *pOVar2;
  bool *pbVar3;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"warnings-as-errors","");
  pOVar2 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar3 = cxxopts::OptionValue::as<bool>(pOVar2);
  this->warningsAsErrors = *pbVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"gltf-basisu","");
  pOVar2 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar3 = cxxopts::OptionValue::as<bool>(pOVar2);
  this->GLTFBasisU = *pbVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter&) {
            warningsAsErrors = args["warnings-as-errors"].as<bool>();
            GLTFBasisU = args["gltf-basisu"].as<bool>();
        }